

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall
CS248::DynamicScene::Skeleton::saveJoint
          (Skeleton *this,XMLDocument *xmlDoc,XMLElement *parentNode,Joint *joint)

{
  pointer ppJVar1;
  XMLElement *addThis;
  XMLElement *pXVar2;
  XMLElement *pXVar3;
  _Base_ptr p_Var4;
  pointer ppJVar5;
  
  addThis = tinyxml2::XMLDocument::NewElement(xmlDoc,"Joint");
  tinyxml2::XMLNode::InsertEndChild(&parentNode->super_XMLNode,&addThis->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Axis");
  tinyxml2::XMLElement::SetAttribute(pXVar2,"x",(joint->axis).x);
  tinyxml2::XMLElement::SetAttribute(pXVar2,"y",(joint->axis).y);
  tinyxml2::XMLElement::SetAttribute(pXVar2,"z",(joint->axis).z);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"RenderScale");
  tinyxml2::XMLElement::SetAttribute(pXVar2,"val",joint->renderScale);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"CapsuleRadius");
  tinyxml2::XMLElement::SetAttribute(pXVar2,"val",joint->capsuleRadius);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Positions");
  for (p_Var4 = *(_Base_ptr *)
                 ((long)&(joint->super_SceneObject).positions.knots._M_t._M_impl.
                         super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var4 !=
      &(joint->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pXVar3 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    tinyxml2::XMLElement::SetAttribute(pXVar3,"Time",*(double *)(p_Var4 + 1));
    tinyxml2::XMLElement::SetAttribute(pXVar3,"x",(double)p_Var4[1]._M_parent);
    tinyxml2::XMLElement::SetAttribute(pXVar3,"y",(double)p_Var4[1]._M_left);
    tinyxml2::XMLElement::SetAttribute(pXVar3,"z",(double)p_Var4[1]._M_right);
    tinyxml2::XMLNode::InsertEndChild(&pXVar2->super_XMLNode,&pXVar3->super_XMLNode);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Rotations");
  for (p_Var4 = *(_Base_ptr *)
                 ((long)&(joint->super_SceneObject).rotations.knots._M_t._M_impl.
                         super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var4 !=
      &(joint->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pXVar3 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    tinyxml2::XMLElement::SetAttribute(pXVar3,"Time",*(double *)(p_Var4 + 1));
    tinyxml2::XMLElement::SetAttribute(pXVar3,"x",(double)p_Var4[1]._M_parent);
    tinyxml2::XMLElement::SetAttribute(pXVar3,"y",(double)p_Var4[1]._M_left);
    tinyxml2::XMLElement::SetAttribute(pXVar3,"z",(double)p_Var4[1]._M_right);
    tinyxml2::XMLNode::InsertEndChild(&pXVar2->super_XMLNode,&pXVar3->super_XMLNode);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Scales");
  for (p_Var4 = *(_Base_ptr *)
                 ((long)&(joint->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                         _M_header + 0x10);
      (_Rb_tree_header *)p_Var4 !=
      &(joint->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pXVar3 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    tinyxml2::XMLElement::SetAttribute(pXVar3,"Time",*(double *)(p_Var4 + 1));
    tinyxml2::XMLElement::SetAttribute(pXVar3,"x",(double)p_Var4[1]._M_parent);
    tinyxml2::XMLElement::SetAttribute(pXVar3,"y",(double)p_Var4[1]._M_left);
    tinyxml2::XMLElement::SetAttribute(pXVar3,"z",(double)p_Var4[1]._M_right);
    tinyxml2::XMLNode::InsertEndChild(&pXVar2->super_XMLNode,&pXVar3->super_XMLNode);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Children");
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  ppJVar1 = (joint->kids).
            super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar5 = (joint->kids).
                 super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar5 != ppJVar1;
      ppJVar5 = ppJVar5 + 1) {
    saveJoint(this,xmlDoc,pXVar2,*ppJVar5);
  }
  return;
}

Assistant:

void Skeleton::saveJoint(XMLDocument* xmlDoc, XMLElement* parentNode,
                         const Joint* joint) {
  XMLElement* pJoint = xmlDoc->NewElement("Joint");
  parentNode->InsertEndChild(pJoint);

  XMLElement* pElement = xmlDoc->NewElement("Axis");
  pElement->SetAttribute("x", joint->axis.x);
  pElement->SetAttribute("y", joint->axis.y);
  pElement->SetAttribute("z", joint->axis.z);
  pJoint->InsertEndChild(pElement);

  pElement = xmlDoc->NewElement("RenderScale");
  pElement->SetAttribute("val", joint->renderScale);
  pJoint->InsertEndChild(pElement);

  pElement = xmlDoc->NewElement("CapsuleRadius");
  pElement->SetAttribute("val", joint->capsuleRadius);
  pJoint->InsertEndChild(pElement);

  // positions
  pElement = xmlDoc->NewElement("Positions");
  for (const auto& item : joint->positions.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  // rotations
  pElement = xmlDoc->NewElement("Rotations");
  for (const auto& item : joint->rotations.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  // scales
  pElement = xmlDoc->NewElement("Scales");
  for (const auto& item : joint->scales.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  XMLElement* pChildren = xmlDoc->NewElement("Children");
  pJoint->InsertEndChild(pChildren);
  for (Joint* j : joint->kids) {
    saveJoint(xmlDoc, pChildren, j);
  }
}